

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.hpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::~ShaderPerformanceMeasurer(ShaderPerformanceMeasurer *this)

{
  deinit(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_attribBuffers).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector
            (&this->m_attributes);
  TheilSenCalibrator::~TheilSenCalibrator(&this->m_calibrator);
  return;
}

Assistant:

~ShaderPerformanceMeasurer	(void) { deinit(); }